

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O1

int zmq_send(void *s_,void *buf_,size_t len_,int flags_)

{
  int iVar1;
  socket_base_t *this;
  size_t sVar2;
  ssize_t sVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  size_t __n;
  int in_R8D;
  zmq_msg_t msg;
  msg_t local_60;
  
  __n = CONCAT44(in_register_0000000c,flags_);
  this = as_socket_base_t(s_);
  if ((this != (socket_base_t *)0x0) &&
     (iVar1 = zmq::msg_t::init_buffer(&local_60,buf_,len_), -1 < iVar1)) {
    sVar2 = zmq::msg_t::size(&local_60);
    sVar3 = zmq::socket_base_t::send(this,(int)&local_60,(void *)(ulong)(uint)flags_,__n,in_R8D);
    sVar4 = 0x7fffffff;
    if (sVar2 < 0x7fffffff) {
      sVar4 = sVar2;
    }
    if (-1 < (int)sVar3) {
      return (int)sVar4;
    }
    zmq_send_cold_1();
  }
  return -1;
}

Assistant:

int zmq_send (void *s_, const void *buf_, size_t len_, int flags_)
{
    zmq::socket_base_t *s = as_socket_base_t (s_);
    if (!s)
        return -1;
    zmq_msg_t msg;
    int rc = zmq_msg_init_buffer (&msg, buf_, len_);
    if (unlikely (rc < 0))
        return -1;

    rc = s_sendmsg (s, &msg, flags_);
    if (unlikely (rc < 0)) {
        const int err = errno;
        const int rc2 = zmq_msg_close (&msg);
        errno_assert (rc2 == 0);
        errno = err;
        return -1;
    }
    //  Note the optimisation here. We don't close the msg object as it is
    //  empty anyway. This may change when implementation of zmq_msg_t changes.
    return rc;
}